

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O0

Expression * __thiscall
wasm::SExpressionWasmBuilder::makeCallRef(SExpressionWasmBuilder *this,Element *s,bool isReturn)

{
  Expression *target_00;
  bool bVar1;
  Element *pEVar2;
  size_t sVar3;
  ParseException *this_00;
  char *__s;
  CallRef *pCVar4;
  Signature SVar5;
  Builder local_a8;
  undefined1 local_9a;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Expression *local_58;
  Expression *target;
  undefined1 local_40 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  HeapType sigType;
  bool isReturn_local;
  Element *s_local;
  SExpressionWasmBuilder *this_local;
  
  pEVar2 = Element::operator[](s,1);
  operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)parseHeapType(this,pEVar2);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_40);
  sVar3 = Element::size(s);
  parseOperands<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            (this,s,2,(int)sVar3 - 1,
             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_40);
  sVar3 = Element::size(s);
  pEVar2 = Element::operator[](s,(int)sVar3 - 1);
  local_58 = parseExpression(this,pEVar2);
  bVar1 = HeapType::isSignature
                    ((HeapType *)
                     &operands.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    local_9a = 1;
    this_00 = (ParseException *)__cxa_allocate_exception(0x30);
    __s = "call_ref";
    if (isReturn) {
      __s = "return_call_ref";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,__s,&local_99);
    std::operator+(&local_78,&local_98," type annotation should be a signature");
    ParseException::ParseException(this_00,&local_78,s->line,s->col);
    local_9a = 0;
    __cxa_throw(this_00,&ParseException::typeinfo,ParseException::~ParseException);
  }
  Builder::Builder(&local_a8,this->wasm);
  target_00 = local_58;
  SVar5 = HeapType::getSignature
                    ((HeapType *)
                     &operands.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  pCVar4 = Builder::makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                     (&local_a8,target_00,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_40,
                      SVar5.results.id,isReturn);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_40);
  return (Expression *)pCVar4;
}

Assistant:

Expression* SExpressionWasmBuilder::makeCallRef(Element& s, bool isReturn) {
  HeapType sigType = parseHeapType(*s[1]);
  std::vector<Expression*> operands;
  parseOperands(s, 2, s.size() - 1, operands);
  auto* target = parseExpression(s[s.size() - 1]);

  if (!sigType.isSignature()) {
    throw ParseException(
      std::string(isReturn ? "return_call_ref" : "call_ref") +
        " type annotation should be a signature",
      s.line,
      s.col);
  }
  return Builder(wasm).makeCallRef(
    target, operands, sigType.getSignature().results, isReturn);
}